

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> *
getChildElements<tinyxml2::XMLDocument>
          (vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
           *__return_storage_ptr__,XMLDocument *element)

{
  XMLElement *local_28;
  XMLElement *childElement;
  XMLDocument *local_18;
  XMLDocument *element_local;
  vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> *childElements
  ;
  
  childElement._7_1_ = 0;
  local_18 = element;
  element_local = (XMLDocument *)__return_storage_ptr__;
  std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>::vector
            (__return_storage_ptr__);
  for (local_28 = tinyxml2::XMLNode::FirstChildElement(&local_18->super_XMLNode,(char *)0x0);
      local_28 != (XMLElement *)0x0;
      local_28 = tinyxml2::XMLNode::NextSiblingElement(&local_28->super_XMLNode,(char *)0x0)) {
    std::vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>::
    push_back(__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<tinyxml2::XMLElement const *> getChildElements( ElementContainer const * element )
{
  std::vector<tinyxml2::XMLElement const *> childElements;
  for ( tinyxml2::XMLElement const * childElement = element->FirstChildElement(); childElement; childElement = childElement->NextSiblingElement() )
  {
    childElements.push_back( childElement );
  }
  return childElements;
}